

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

UBool __thiscall icu_63::ICUServiceKey::isFallbackOf(ICUServiceKey *this,UnicodeString *id)

{
  UBool UVar1;
  UnicodeString *id_local;
  ICUServiceKey *this_local;
  
  UVar1 = UnicodeString::operator==(id,&this->_id);
  return UVar1;
}

Assistant:

UBool 
ICUServiceKey::isFallbackOf(const UnicodeString& id) const 
{
    return id == _id;
}